

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O2

void __thiscall QRasterPaintEnginePrivate::systemStateChanged(QRasterPaintEnginePrivate *this)

{
  QRegion *r;
  long lVar1;
  QPaintEngineState *pQVar2;
  Representation RVar3;
  Representation RVar4;
  Representation RVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long in_FS_OFFSET;
  QRect QVar10;
  QRegion clippedDeviceRgn;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar7 = (*this->device->_vptr_QPaintDevice[4])(this->device,1);
  if (0x7ffffe < iVar7) {
    iVar7 = 0x7fffff;
  }
  iVar8 = (*this->device->_vptr_QPaintDevice[4])(this->device,2);
  iVar9 = 0x7fffff;
  if (iVar8 < 0x7fffff) {
    iVar9 = iVar8;
  }
  (this->deviceRectUnclipped).x1 = 0;
  (this->deviceRectUnclipped).y1 = 0;
  (this->deviceRectUnclipped).x2.m_i = iVar7 + -1;
  (this->deviceRectUnclipped).y2.m_i = iVar9 + -1;
  r = &(this->super_QPaintEngineExPrivate).super_QPaintEnginePrivate.systemClip;
  bVar6 = QRegion::isEmpty(r);
  if (bVar6) {
    RVar3.m_i = (this->deviceRectUnclipped).y1.m_i;
    RVar4.m_i = (this->deviceRectUnclipped).x2.m_i;
    RVar5.m_i = (this->deviceRectUnclipped).y2.m_i;
    (this->deviceRect).x1 = (Representation)(this->deviceRectUnclipped).x1.m_i;
    (this->deviceRect).y1 = (Representation)RVar3.m_i;
    (this->deviceRect).x2 = (Representation)RVar4.m_i;
    (this->deviceRect).y2 = (Representation)RVar5.m_i;
    QClipData::setClipRect((this->baseClip).d,&this->deviceRect);
  }
  else {
    clippedDeviceRgn.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::operator&(&clippedDeviceRgn,(QRect *)r);
    QVar10 = QRegion::boundingRect(&clippedDeviceRgn);
    this->deviceRect = QVar10;
    QClipData::setClipRegion((this->baseClip).d,&clippedDeviceRgn);
    QRegion::~QRegion(&clippedDeviceRgn);
  }
  iVar7 = (this->deviceRect).y1.m_i;
  iVar9 = (this->deviceRect).x2.m_i;
  iVar8 = (this->deviceRect).y2.m_i;
  (this->super_QPaintEngineExPrivate).exDeviceRect.x1.m_i = (this->deviceRect).x1.m_i;
  (this->super_QPaintEngineExPrivate).exDeviceRect.y1.m_i = iVar7;
  (this->super_QPaintEngineExPrivate).exDeviceRect.x2.m_i = iVar9;
  (this->super_QPaintEngineExPrivate).exDeviceRect.y2.m_i = iVar8;
  pQVar2 = ((this->super_QPaintEngineExPrivate).super_QPaintEnginePrivate.q_ptr)->state;
  if (pQVar2 != (QPaintEngineState *)0x0) {
    *(byte *)&pQVar2[0xb4].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
              super_QFlagsStorage<QPaintEngine::DirtyFlag>.i =
         (byte)pQVar2[0xb4].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
               super_QFlagsStorage<QPaintEngine::DirtyFlag>.i | 0x80;
    *(ulong *)(pQVar2 + 0xfa) = *(ulong *)(pQVar2 + 0xfa) | 0x8000000080;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEnginePrivate::systemStateChanged()
{
    deviceRectUnclipped = QRect(0, 0,
            qMin(QT_RASTER_COORD_LIMIT, device->width()),
            qMin(QT_RASTER_COORD_LIMIT, device->height()));

    if (!systemClip.isEmpty()) {
        QRegion clippedDeviceRgn = systemClip & deviceRectUnclipped;
        deviceRect = clippedDeviceRgn.boundingRect();
        baseClip->setClipRegion(clippedDeviceRgn);
    } else {
        deviceRect = deviceRectUnclipped;
        baseClip->setClipRect(deviceRect);
    }
#ifdef QT_DEBUG_DRAW
    qDebug() << "systemStateChanged" << this << "deviceRect" << deviceRect << deviceRectUnclipped << systemClip;
#endif

    exDeviceRect = deviceRect;

    Q_Q(QRasterPaintEngine);
    if (q->state()) {
        q->state()->strokeFlags |= QPaintEngine::DirtyClipRegion;
        q->state()->fillFlags |= QPaintEngine::DirtyClipRegion;
        q->state()->pixmapFlags |= QPaintEngine::DirtyClipRegion;
    }
}